

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fReadPixelsTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ReadPixelsTests::init(ReadPixelsTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  ReadPixelsTest *pRVar3;
  GLenum unaff_EBX;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"alignment",
             "Read pixels pack alignment parameter tests");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_1",(char *)0x0,1,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_2",(char *)0x0,2,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_4",(char *)0x0,4,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_8",(char *)0x0,8,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_1",(char *)0x2,1,0,0,0,0x8d99,
             0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_2",(char *)0x2,2,0,0,0,0x8d99,
             0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_4",(char *)0x2,4,0,0,0,0x8d99,
             0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_8",(char *)0x2,8,0,0,0,0x8d99,
             0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_1",(char *)0x2,1,0,0,0,0x8d99,
             0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_2",(char *)0x2,2,0,0,0,0x8d99,
             0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_4",(char *)0x2,4,0,0,0,0x8d99,
             0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_8",(char *)0x2,8,0,0,0,0x8d99,
             0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_1",&DAT_00000001,1,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_2",&DAT_00000001,2,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_4",&DAT_00000001,4,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_8",&DAT_00000001,8,0,0,0,0x1908,
             0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"rowlength","Read pixels rowlength test");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_17",(char *)0x0,4,0x11,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_19",(char *)0x0,4,0x13,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_23",(char *)0x0,4,0x17,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_29",(char *)0x0,4,0x1d,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_17",(char *)0x2,4,0x11,0,0,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_19",(char *)0x2,4,0x13,0,0,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_23",(char *)0x2,4,0x17,0,0,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_29",(char *)0x2,4,0x1d,0,0,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_17",(char *)0x2,4,0x11,0,0,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_19",(char *)0x2,4,0x13,0,0,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_23",(char *)0x2,4,0x17,0,0,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_29",(char *)0x2,4,0x1d,0,0,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_17",&DAT_00000001,4,0x11,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_19",&DAT_00000001,4,0x13,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_23",&DAT_00000001,4,0x17,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_29",&DAT_00000001,4,0x1d,0,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"skip",
             "Read pixels skip pixels and rows test");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_0_3",(char *)0x0,4,0x11,0,3,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_3_0",(char *)0x0,4,0x11,3,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_3_3",(char *)0x0,4,0x11,3,3,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_ubyte_3_5",(char *)0x0,4,0x11,3,5,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_0_3",(char *)0x2,4,0x11,0,3,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_3_0",(char *)0x2,4,0x11,3,0,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_3_3",(char *)0x2,4,0x11,3,3,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_int_3_5",(char *)0x2,4,0x11,3,5,
             0x8d99,0x1404,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_0_3",(char *)0x2,4,0x11,0,3,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_3_0",(char *)0x2,4,0x11,3,0,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_3_3",(char *)0x2,4,0x11,3,3,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"rgba_uint_3_5",(char *)0x2,4,0x11,3,5,
             0x8d99,0x1405,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_0_3",&DAT_00000001,4,0x11,0,3,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_3_0",&DAT_00000001,4,0x11,3,0,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_3_3",&DAT_00000001,4,0x11,3,3,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  pRVar3 = (ReadPixelsTest *)operator_new(0xa0);
  Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
            (pRVar3,(this->super_TestCaseGroup).m_context,"choose_3_5",&DAT_00000001,4,0x11,3,5,
             0x1908,0x1401,unaff_EBX);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ReadPixelsTests::init (void)
{
	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "alignment", "Read pixels pack alignment parameter tests");

		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_1", "", ReadPixelsTest::FLAG_NO_FLAGS, 1, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_2", "", ReadPixelsTest::FLAG_NO_FLAGS, 2, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_4", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_8", "", ReadPixelsTest::FLAG_NO_FLAGS, 8, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));

		group->addChild(new ReadPixelsTest(m_context, "rgba_int_1", "", ReadPixelsTest::FLAG_USE_RBO, 1, 0, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_2", "", ReadPixelsTest::FLAG_USE_RBO, 2, 0, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_4", "", ReadPixelsTest::FLAG_USE_RBO, 4, 0, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_8", "", ReadPixelsTest::FLAG_USE_RBO, 8, 0, 0, 0, GL_RGBA_INTEGER, GL_INT));

		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_1", "", ReadPixelsTest::FLAG_USE_RBO, 1, 0, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_2", "", ReadPixelsTest::FLAG_USE_RBO, 2, 0, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_4", "", ReadPixelsTest::FLAG_USE_RBO, 4, 0, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_8", "", ReadPixelsTest::FLAG_USE_RBO, 8, 0, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));

		group->addChild(new ReadPixelsTest(m_context, "choose_1", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 1, 0, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_2", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 2, 0, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_4", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 0, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_8", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 8, 0, 0, 0));

		addChild(group);
	}

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "rowlength", "Read pixels rowlength test");
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_17", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 17, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_19", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 19, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_23", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 23, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_29", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 29, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE));

		group->addChild(new ReadPixelsTest(m_context, "rgba_int_17", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_19", "", ReadPixelsTest::FLAG_USE_RBO, 4, 19, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_23", "", ReadPixelsTest::FLAG_USE_RBO, 4, 23, 0, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_29", "", ReadPixelsTest::FLAG_USE_RBO, 4, 29, 0, 0, GL_RGBA_INTEGER, GL_INT));

		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_17", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_19", "", ReadPixelsTest::FLAG_USE_RBO, 4, 19, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_23", "", ReadPixelsTest::FLAG_USE_RBO, 4, 23, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_29", "", ReadPixelsTest::FLAG_USE_RBO, 4, 29, 0, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));

		group->addChild(new ReadPixelsTest(m_context, "choose_17", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 17, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_19", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 19, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_23", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 23, 0, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_29", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 29, 0, 0));

		addChild(group);
	}

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "skip", "Read pixels skip pixels and rows test");
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_0_3", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 17, 0, 3, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_3_0", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 17, 3, 0, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_3_3", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 17, 3, 3, GL_RGBA, GL_UNSIGNED_BYTE));
		group->addChild(new ReadPixelsTest(m_context, "rgba_ubyte_3_5", "", ReadPixelsTest::FLAG_NO_FLAGS, 4, 17, 3, 5, GL_RGBA, GL_UNSIGNED_BYTE));

		group->addChild(new ReadPixelsTest(m_context, "rgba_int_0_3", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 0, 3, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_3_0", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 0, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_3_3", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 3, GL_RGBA_INTEGER, GL_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_int_3_5", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 5, GL_RGBA_INTEGER, GL_INT));

		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_0_3", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 0, 3, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_3_0", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 0, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_3_3", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 3, GL_RGBA_INTEGER, GL_UNSIGNED_INT));
		group->addChild(new ReadPixelsTest(m_context, "rgba_uint_3_5", "", ReadPixelsTest::FLAG_USE_RBO, 4, 17, 3, 5, GL_RGBA_INTEGER, GL_UNSIGNED_INT));

		group->addChild(new ReadPixelsTest(m_context, "choose_0_3", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 17, 0, 3));
		group->addChild(new ReadPixelsTest(m_context, "choose_3_0", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 17, 3, 0));
		group->addChild(new ReadPixelsTest(m_context, "choose_3_3", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 17, 3, 3));
		group->addChild(new ReadPixelsTest(m_context, "choose_3_5", "", ReadPixelsTest::FLAG_CHOOSE_FORMAT, 4, 17, 3, 5));

		addChild(group);
	}
}